

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusivePublication.h
# Opt level: O3

int64_t __thiscall
aeron::ExclusivePublication::offer
          (ExclusivePublication *this,AtomicBuffer *buffer,index_t offset,index_t length,
          on_reserved_value_supplier_t *reservedValueSupplier)

{
  int iVar1;
  _Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  this_00;
  AtomicBuffer *pAVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = 0xfffffffffffffffc;
  if (((this->m_isClosed)._M_base._M_i & 1U) == 0) {
    iVar1 = (this->m_publicationLimit).m_impl.m_offset;
    concurrent::AtomicBuffer::boundsCheck((AtomicBuffer *)&this->m_publicationLimit,iVar1,8);
    lVar6 = this->m_termBeginPosition + (long)this->m_termOffset;
    if (lVar6 < *(long *)((this->m_publicationLimit).m_impl.m_buffer.m_buffer + iVar1)) {
      this_00.super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>.
      _M_head_impl = this->m_appenders[this->m_activePartitionIndex]._M_t.
                     super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                     .
                     super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>
      ;
      if (this->m_maxPayloadLength < length) {
        checkMaxMessageLength(this,length);
        uVar3 = concurrent::logbuffer::ExclusiveTermAppender::appendFragmentedMessage
                          ((ExclusiveTermAppender *)
                           this_00.
                           super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>
                           ._M_head_impl,this->m_termId,this->m_termOffset,&this->m_headerWriter,
                           buffer,offset,length,this->m_maxPayloadLength,reservedValueSupplier);
      }
      else {
        uVar3 = concurrent::logbuffer::ExclusiveTermAppender::appendUnfragmentedMessage
                          ((ExclusiveTermAppender *)
                           this_00.
                           super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>
                           ._M_head_impl,this->m_termId,this->m_termOffset,&this->m_headerWriter,
                           buffer,offset,length,reservedValueSupplier);
      }
      if ((int)uVar3 < 1) {
        lVar6 = (long)(int)(this->m_appenders[0]._M_t.
                            super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                            .
                            super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>
                           ._M_head_impl)->m_termBuffer->m_length + this->m_termBeginPosition;
        uVar5 = 0xfffffffffffffffb;
        if (lVar6 < this->m_maxPossiblePosition) {
          iVar4 = this->m_activePartitionIndex + ((this->m_activePartitionIndex + 1) / 3) * -3 + 1;
          uVar3 = this->m_termId + 1;
          this->m_activePartitionIndex = iVar4;
          this->m_termOffset = 0;
          this->m_termId = uVar3;
          this->m_termBeginPosition = lVar6;
          iVar1 = this->m_initialTermId;
          pAVar2 = this->m_logMetaDataBuffer;
          concurrent::AtomicBuffer::boundsCheck(pAVar2,iVar4 * 8,8);
          *(ulong *)(pAVar2->m_buffer + (long)iVar4 * 8) = (ulong)uVar3 << 0x20;
          pAVar2 = this->m_logMetaDataBuffer;
          concurrent::AtomicBuffer::boundsCheck(pAVar2,0x18,4);
          *(uint *)(pAVar2->m_buffer + 0x18) = uVar3 - iVar1;
          uVar5 = 0xfffffffffffffffd;
        }
      }
      else {
        this->m_termOffset = uVar3;
        uVar5 = (ulong)uVar3 + this->m_termBeginPosition;
      }
    }
    else {
      uVar5 = 0xfffffffffffffffb;
      if (lVar6 + length < this->m_maxPossiblePosition) {
        pAVar2 = this->m_logMetaDataBuffer;
        concurrent::AtomicBuffer::boundsCheck(pAVar2,0x88,4);
        uVar5 = ~(ulong)(*(int *)(pAVar2->m_buffer + 0x88) == 1);
      }
    }
  }
  return uVar5;
}

Assistant:

inline std::int64_t offer(
        const concurrent::AtomicBuffer& buffer,
        util::index_t offset,
        util::index_t length,
        const on_reserved_value_supplier_t& reservedValueSupplier)
    {
        std::int64_t newPosition = PUBLICATION_CLOSED;

        if (!isClosed())
        {
            const std::int64_t limit = m_publicationLimit.getVolatile();
            ExclusiveTermAppender *termAppender = m_appenders[m_activePartitionIndex].get();
            const std::int64_t position = m_termBeginPosition + m_termOffset;

            if (position < limit)
            {
                std::int32_t result;
                if (length <= m_maxPayloadLength)
                {
                    result = termAppender->appendUnfragmentedMessage(
                        m_termId,
                        m_termOffset,
                        m_headerWriter,
                        buffer,
                        offset,
                        length,
                        reservedValueSupplier);
                }
                else
                {
                    checkMaxMessageLength(length);
                    result = termAppender->appendFragmentedMessage(
                        m_termId,
                        m_termOffset,
                        m_headerWriter,
                        buffer,
                        offset,
                        length,
                        m_maxPayloadLength,
                        reservedValueSupplier);
                }

                newPosition = ExclusivePublication::newPosition(result);
            }
            else
            {
                newPosition = ExclusivePublication::backPressureStatus(position, length);
            }
        }

        return newPosition;
    }